

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SccLiveness.cpp
# Opt level: O0

uint __thiscall SCCLiveness::CurrentOpHelperVisitedLength(SCCLiveness *this,Instr *currentInstr)

{
  code *pcVar1;
  bool bVar2;
  IRKind IVar3;
  uint32 uVar4;
  uint32 uVar5;
  undefined4 *puVar6;
  bool local_3d;
  uint local_2c;
  uint visitedLength;
  Instr *currentInstr_local;
  SCCLiveness *this_local;
  
  if (currentInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SccLiveness.cpp"
                       ,0x367,"(currentInstr)","currentInstr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (this->lastOpHelperLabel == (LabelInstr *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    uVar4 = IR::Instr::GetNumber(currentInstr);
    uVar5 = IR::Instr::GetNumber(&this->lastOpHelperLabel->super_Instr);
    if (uVar4 < uVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SccLiveness.cpp"
                         ,0x36e,"(currentInstr->GetNumber() >= lastOpHelperLabel->GetNumber())",
                         "currentInstr->GetNumber() >= lastOpHelperLabel->GetNumber()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    uVar4 = IR::Instr::GetNumber(currentInstr);
    uVar5 = IR::Instr::GetNumber(&this->lastOpHelperLabel->super_Instr);
    local_2c = uVar4 - uVar5;
    IVar3 = IR::Instr::GetKind(currentInstr);
    local_3d = true;
    if (IVar3 != InstrKindLabel) {
      local_3d = IR::Instr::IsProfiledLabelInstr(currentInstr);
    }
    if (local_3d == false) {
      local_2c = local_2c + 1;
    }
    this_local._4_4_ = local_2c;
  }
  return this_local._4_4_;
}

Assistant:

uint SCCLiveness::CurrentOpHelperVisitedLength(IR::Instr *const currentInstr) const
{
    Assert(currentInstr);

    if(!lastOpHelperLabel)
    {
        return 0;
    }

    Assert(currentInstr->GetNumber() >= lastOpHelperLabel->GetNumber());
    uint visitedLength = currentInstr->GetNumber() - lastOpHelperLabel->GetNumber();
    if(!currentInstr->IsLabelInstr())
    {
        // Consider the current instruction to have been visited
        ++visitedLength;
    }
    return visitedLength;
}